

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

QRect __thiscall QDockAreaLayout::gapRect(QDockAreaLayout *this,DockPosition dockPos)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  QWidgetData *pQVar6;
  undefined1 auVar7 [16];
  int iVar8;
  undefined4 in_ECX;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  double dVar16;
  undefined1 auVar17 [16];
  QRect QVar18;
  
  pQVar6 = (this->mainWindow->super_QWidget).data;
  uVar1 = (pQVar6->crect).x2;
  uVar3 = (pQVar6->crect).y2;
  uVar2 = (pQVar6->crect).x1;
  uVar4 = (pQVar6->crect).y1;
  iVar15 = (uVar3 - uVar4) + 1;
  dVar16 = (double)((uVar1 - uVar2) + 1) * 0.5;
  auVar17._0_8_ = (double)((ulong)dVar16 & 0x8000000000000000 | 0x3fe0000000000000) + dVar16;
  auVar17._8_8_ =
       (double)((ulong)((double)iVar15 * 0.5) & 0x8000000000000000 | 0x3fe0000000000000) +
       (double)iVar15 * 0.5;
  auVar17 = minpd(_DAT_0066f5d0,auVar17);
  iVar13 = (int)auVar17._0_8_;
  if (0x4f < iVar13) {
    iVar13 = 0x50;
  }
  iVar8 = (int)auVar17._8_8_;
  auVar7._8_8_ = -(ulong)(-2147483648.0 < auVar17._8_8_);
  auVar7._0_8_ = -(ulong)(-2147483648.0 < auVar17._0_8_);
  uVar9 = movmskpd(in_ECX,auVar7);
  iVar14 = 0x50;
  if (iVar8 < 0x50) {
    iVar14 = iVar8;
  }
  if ((uVar9 & 1) == 0) {
    iVar13 = -0x80000000;
  }
  if ((uVar9 & 2) == 0) {
    iVar14 = -0x80000000;
  }
  if ((SBORROW4(iVar15,this->sep * 2) != iVar15 + this->sep * -2 < 0) &&
     (QtPrivateLogging::lcQpaDockWidgets(),
     ((byte)QtPrivateLogging::lcQpaDockWidgets::category.field_2.bools.enabledWarning._q_value.
            _M_base._M_i & 1) != 0)) {
    gapRect();
  }
  pQVar6 = (this->mainWindow->super_QWidget).data;
  if ((((pQVar6->crect).x2.m_i - (pQVar6->crect).x1.m_i) + 1 < this->sep * 2) &&
     (QtPrivateLogging::lcQpaDockWidgets(),
     ((byte)QtPrivateLogging::lcQpaDockWidgets::category.field_2.bools.enabledWarning._q_value.
            _M_base._M_i & 1) != 0)) {
    gapRect();
  }
  switch(dockPos) {
  case LeftDock:
    uVar9 = (this->rect).x1.m_i;
    uVar11 = (ulong)(uint)(this->rect).y1.m_i;
    uVar12 = (ulong)(uint)(this->rect).y2.m_i;
    uVar10 = (iVar13 + uVar9) - 1;
    break;
  case RightDock:
    uVar11 = (ulong)(uint)(this->rect).y1.m_i;
    iVar15 = (this->rect).x2.m_i;
    uVar9 = iVar15 - iVar13;
    uVar12 = (ulong)(uint)(this->rect).y2.m_i;
    uVar10 = iVar15 - 1;
    break;
  case TopDock:
    uVar9 = (this->rect).x1.m_i;
    uVar5 = (this->rect).y1.m_i;
    uVar11 = (ulong)uVar5;
    uVar10 = (this->rect).x2.m_i;
    uVar12 = (ulong)((iVar14 + uVar5) - 1);
    break;
  case BottomDock:
    uVar9 = (this->rect).x1.m_i;
    uVar10 = (this->rect).x2.m_i;
    iVar13 = (this->rect).y2.m_i;
    uVar11 = (ulong)(uint)(iVar13 - iVar14);
    uVar12 = (ulong)(iVar13 - 1);
    break;
  default:
    uVar10 = 0xffffffff;
    uVar9 = 0;
    uVar11 = 0;
    uVar12 = 0xffffffff;
  }
  QVar18._0_8_ = (ulong)uVar9 | uVar11 << 0x20;
  QVar18._8_8_ = (ulong)uVar10 | uVar12 << 0x20;
  return QVar18;
}

Assistant:

QRect QDockAreaLayout::gapRect(QInternal::DockPosition dockPos) const
{
    Q_ASSERT_X(mainWindow, "QDockAreaLayout::gapRect", "Called without valid mainWindow pointer.");

    // Determine gap size depending on MainWindow size (QTBUG-101657)
    const QSize gapSize = (mainWindow->size()/2).boundedTo(QSize(EmptyDropAreaSize, EmptyDropAreaSize));

    // Warn if main window is too small to create proper docks.
    // Do not fail because this can be triggered by a user making MainWindow too small
    if (mainWindow->height() < (2 * sep)) {
        qCWarning(lcQpaDockWidgets,
            "QDockAreaLayout::gapRect: Main window height %i is too small. Docking will not be possible.",
            mainWindow->height());

    }
    if (mainWindow->width() < (2 * sep)) {
        qCWarning(lcQpaDockWidgets,
            "QDockAreaLayout::gapRect: Main window width %i is too small. Docking will not be possible.",
            mainWindow->width());
    }

    // Calculate rectangle of requested dock
    switch (dockPos) {
    case QInternal::LeftDock:
        return QRect(rect.left(), rect.top(), gapSize.width(), rect.height());
    case QInternal::RightDock:
        return QRect(rect.right() - gapSize.width(), rect.top(), gapSize.width(), rect.height());
    case QInternal::TopDock:
        return QRect(rect.left(), rect.top(), rect.width(), gapSize.height());
    case QInternal::BottomDock:
        return QRect(rect.left(), rect.bottom() - gapSize.height(), rect.width(), gapSize.height());
    case QInternal::DockCount:
        break;
    }
    return QRect();
}